

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

Excluded s2pred::TriageVoronoiSiteExclusion<double>
                   (Vector3<double> *a,Vector3<double> *b,Vector3<double> *x0,Vector3<double> *x1,
                   double r2)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  Vector3<double> *pVVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double local_40;
  ostream *local_38;
  
  dVar21 = x0->c_[2];
  dVar8 = x1->c_[2];
  dVar32 = x0->c_[0];
  dVar23 = x0->c_[1];
  dVar19 = x1->c_[0];
  dVar10 = x1->c_[1];
  dVar24 = (dVar23 - dVar10) * (dVar21 + dVar8) - (dVar23 + dVar10) * (dVar21 - dVar8);
  dVar25 = (dVar23 + dVar10) * (dVar32 - dVar19) - (dVar23 - dVar10) * (dVar32 + dVar19);
  dVar28 = (dVar32 + dVar19) * (dVar21 - dVar8) - (dVar32 - dVar19) * (dVar21 + dVar8);
  dVar18 = dVar28 * dVar28 + dVar24 * dVar24 + dVar25 * dVar25;
  dVar30 = SQRT(dVar18);
  dVar22 = a->c_[0];
  dVar12 = a->c_[1];
  dVar11 = a->c_[2];
  dVar21 = (dVar21 - dVar11) * (dVar21 - dVar11) +
           (dVar32 - dVar22) * (dVar32 - dVar22) + (dVar23 - dVar12) * (dVar23 - dVar12);
  dVar32 = (dVar8 - dVar11) * (dVar8 - dVar11) +
           (dVar19 - dVar22) * (dVar19 - dVar22) + (dVar10 - dVar12) * (dVar10 - dVar12);
  pVVar6 = x0;
  dVar8 = dVar21;
  if (dVar32 <= dVar21) {
    pVVar6 = x1;
    dVar8 = dVar32;
    if ((dVar21 == dVar32) && (!NAN(dVar21) && !NAN(dVar32))) {
      lVar5 = 0;
      do {
        dVar23 = *(double *)((long)x0->c_ + lVar5);
        dVar19 = *(double *)((long)x1->c_ + lVar5);
        pVVar6 = x0;
        dVar8 = dVar21;
        if ((dVar23 < dVar19) || (pVVar6 = x1, dVar8 = dVar32, dVar19 < dVar23)) break;
        bVar7 = lVar5 != 0x10;
        lVar5 = lVar5 + 8;
      } while (bVar7);
    }
  }
  dVar21 = (dVar30 * 6.964101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16;
  dVar32 = (r2 * -0.25 + 1.0) * r2 * dVar18;
  dVar22 = (dVar11 - pVVar6->c_[2]) * dVar25 +
           (dVar22 - pVVar6->c_[0]) * dVar24 + 0.0 + (dVar12 - pVVar6->c_[1]) * dVar28;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = dVar8 * dVar21;
  dVar23 = dVar32 - dVar22 * dVar22;
  dVar10 = ABS(dVar22);
  dVar12 = (dVar10 + dVar10 + dVar8) * dVar8 + dVar22 * dVar22 * 1.3322676295501878e-15 +
           dVar32 * 6.661338147750939e-16;
  dVar19 = dVar23 - dVar12;
  if (0.0 <= dVar19) {
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      dVar23 = SQRT(dVar23);
    }
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    dVar11 = b->c_[0];
    dVar31 = b->c_[1];
    dVar2 = b->c_[2];
    dVar13 = x0->c_[0] - dVar11;
    dVar15 = x0->c_[2] - dVar2;
    dVar14 = x1->c_[0] - dVar11;
    dVar20 = x1->c_[2] - dVar2;
    dVar16 = x0->c_[1] - dVar31;
    dVar17 = x1->c_[1] - dVar31;
    dVar13 = dVar15 * dVar15 + dVar13 * dVar13 + dVar16 * dVar16;
    dVar20 = dVar20 * dVar20 + dVar14 * dVar14 + dVar17 * dVar17;
    pVVar6 = x0;
    dVar14 = dVar13;
    if (dVar20 <= dVar13) {
      pVVar6 = x1;
      dVar14 = dVar20;
      if ((dVar13 == dVar20) && (!NAN(dVar13) && !NAN(dVar20))) {
        lVar5 = 0;
        do {
          dVar15 = *(double *)((long)x0->c_ + lVar5);
          dVar16 = *(double *)((long)x1->c_ + lVar5);
          pVVar6 = x0;
          dVar14 = dVar13;
          if ((dVar15 < dVar16) || (pVVar6 = x1, dVar14 = dVar20, dVar16 < dVar15)) break;
          bVar7 = lVar5 != 0x10;
          lVar5 = lVar5 + 8;
        } while (bVar7);
      }
    }
    dVar11 = dVar25 * (dVar2 - pVVar6->c_[2]) +
             (dVar11 - pVVar6->c_[0]) * dVar24 + 0.0 + dVar28 * (dVar31 - pVVar6->c_[1]);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar21 = dVar21 * dVar14;
    dVar14 = dVar32 - dVar11 * dVar11;
    dVar13 = ABS(dVar11);
    dVar20 = dVar32 * 6.661338147750939e-16 +
             (dVar13 + dVar13 + dVar21) * dVar21 + dVar11 * dVar11 * 1.3322676295501878e-15;
    dVar32 = dVar14 - dVar20;
    if (0.0 <= dVar32) {
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      dVar31 = r2 * -0.5 + 1.0;
      auVar9._0_8_ = dVar12 * 0.5;
      auVar9._8_8_ = dVar20 * 0.5;
      if (dVar32 < 0.0) {
        dVar32 = sqrt(dVar32);
      }
      else {
        dVar32 = SQRT(dVar32);
      }
      auVar1._8_8_ = dVar32;
      auVar1._0_8_ = dVar19;
      auVar9 = divpd(auVar9,auVar1);
      dVar32 = a->c_[0];
      dVar19 = b->c_[0];
      dVar12 = a->c_[1];
      dVar20 = a->c_[2];
      dVar2 = b->c_[1];
      dVar15 = b->c_[2];
      dVar16 = (dVar20 + dVar15) * (dVar12 - dVar2) - (dVar20 - dVar15) * (dVar12 + dVar2);
      dVar33 = (dVar14 - dVar23) * dVar31;
      dVar26 = (dVar32 - dVar19) * (dVar12 + dVar2) - (dVar32 + dVar19) * (dVar12 - dVar2);
      dVar29 = (dVar32 + dVar19) * (dVar20 - dVar15) - (dVar32 - dVar19) * (dVar20 + dVar15);
      dVar27 = ABS(dVar33);
      dVar17 = SQRT(dVar29 * dVar29 + dVar16 * dVar16 + dVar26 * dVar26);
      dVar24 = (dVar28 * dVar29 + dVar24 * dVar16 + 0.0 + dVar25 * dVar26) * 0.5;
      dVar25 = dVar27 * 3.3306690738754696e-16 +
               (dVar14 * 1.6653345369377348e-16 + auVar9._8_8_ +
               dVar23 * 1.6653345369377348e-16 + auVar9._0_8_) * dVar31;
      dVar28 = (dVar30 + dVar17) * 3.4158679198689225e-31 + dVar17 * 1.1062375032830644e-15 * dVar30
      ;
      dVar23 = dVar27 - dVar24;
      dVar30 = dVar25 + dVar28;
      if (dVar23 < -dVar30) {
        return NEITHER;
      }
      dVar22 = (dVar20 * dVar15 + dVar32 * dVar19 + 0.0 + dVar12 * dVar2) * dVar18 - dVar22 * dVar11
      ;
      dVar21 = dVar18 * 1.7763568394002505e-15 +
               (dVar8 + dVar10) * dVar21 + (dVar10 * 1.4432899320127035e-15 + dVar8) * dVar13;
      if (dVar22 <= -dVar21) {
        return NEITHER;
      }
      if (dVar21 <= dVar22) {
        if (-dVar28 <= dVar24) {
          if (dVar28 < dVar24) {
            if (dVar23 <= dVar30) {
              return UNCERTAIN;
            }
            goto LAB_0021967c;
          }
        }
        else {
          S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_40,2.0);
          uVar3 = 0xffffffff;
          if (-dVar25 <= dVar33) {
            uVar3 = TriageCompareCosDistance<double>(a,x0,local_40);
          }
          uVar4 = 0xffffffff;
          if (dVar33 <= dVar25) {
            uVar4 = TriageCompareCosDistance<double>(b,x1,local_40);
          }
          if ((int)(uVar4 & uVar3) < 0) {
            return NEITHER;
          }
          if ((dVar30 < dVar23) && (0 < (int)uVar3 || 0 < (int)uVar4)) {
            if (dVar27 <= dVar25) {
              return UNCERTAIN;
            }
LAB_0021967c:
            if (dVar25 < dVar27) {
              return (uint)(dVar33 <= 0.0);
            }
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                       ,0x4f4,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_38,"Check failed: (abs_lhs3) > (lhs3_error) ",0x28);
            abort();
          }
        }
      }
    }
  }
  return UNCERTAIN;
}

Assistant:

Excluded TriageVoronoiSiteExclusion(const Vector3<T>& a, const Vector3<T>& b,
                                    const Vector3<T>& x0, const Vector3<T>& x1,
                                    T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius r (i.e., squared chord angle length r2).  Similarly, define the
  // "coverage interval" of S along an edge X to be the intersection of X with
  // the coverage disc of S.  The coverage interval can be represented as the
  // point at the center of the interval and an angle that measures the
  // semi-width or "radius" of the interval.
  //
  // To test whether site A excludes site B along the input edge X, we test
  // whether the coverage interval of A contains the coverage interval of B.
  // Let "ra" and "rb" be the radii (semi-widths) of the two intervals, and
  // let "d" be the angle between their center points.  Then "a" properly
  // contains "b" if (ra - rb > d), and "b" contains "a" if (rb - ra > d).
  // Note that only one of these conditions can be true.  Therefore we can
  // determine whether one site excludes the other by checking whether
  //
  // (1)   |rb - ra| > d
  //
  // and use the sign of (rb - ra) to determine which site is excluded.
  //
  // The actual code is based on the following.  Let A1 and B1 be the unit
  // vectors A and B scaled by cos(r) (these points are inside the sphere).
  // The planes perpendicular to OA1 and OA2 cut off two discs of radius r
  // around A and B.  Now consider the two lines (inside the sphere) where
  // these planes intersect the plane containing the input edge X, and let A2
  // and B2 be the points on these lines that are closest to A and B.  The
  // coverage intervals of A and B can be represented as an interval along
  // each of these lines, centered at A2 and B2.  Let P1 and P2 be the
  // endpoints of the coverage interval for A, and let Q1 and Q2 be the
  // endpoints of the coverage interval for B.  We can view each coverage
  // interval as either a chord through the sphere's interior, or as a segment
  // of the original edge X (by projecting the chord onto the sphere's
  // surface).
  //
  // To check whether B's interval is contained by A's interval, we test
  // whether both endpoints of B's interval (Q1 and Q2) are contained by A's
  // interval.  E.g., we could test whether Qi.DotProd(A2) > A2.Norm2().
  //
  // However rather than constructing the actual points A1, A2, and so on, it
  // turns out to be more efficient to compute the sines and cosines
  // ("components") of the various angles and then use trigonometric
  // identities.  Predicate (1) can be expressed as
  //
  //      |sin(rb - ra)| > sin(d)
  //
  // provided that |d| <= Pi/2 (which must be checked), and then expanded to
  //
  // (2)  |sin(rb) cos(ra) - sin(ra) cos(rb)| > sin(d) .
  //
  // The components of the various angles can be expressed using dot and cross
  // products based on the construction above:
  //
  //   sin(ra) = sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2) / |aXn|
  //   cos(ra) = cos(r) |a| |n| / |aXn|
  //   sin(rb) = sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) / |bXn|
  //   cos(rb) = cos(r) |b| |n| / |bXn|
  //   sin(d)  = (aXb).n |n| / (|aXn| |bXn|)
  //   cos(d)  = (aXn).(bXn) / (|aXn| |bXn|)
  //
  // Also, the squared chord length r2 is equal to 4 * sin^2(r / 2), which
  // yields the following relationships:
  //
  //   sin(r)  = sqrt(r2 (1 - r2 / 4))
  //   cos(r)  = 1 - r2 / 2
  //
  // We then scale both sides of (2) by |aXn| |bXn| / |n| (in order to
  // minimize the number of calculations and to avoid divisions), which gives:
  //
  //    cos(r) ||a| sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) -
  //            |b| sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2)| > (aXb).n
  //
  // Furthermore we can substitute |a| = |b| = 1 (as long as this is taken
  // into account in the error bounds), yielding
  //
  // (3)   cos(r) |sqrt(sin^2(r) |n|^2 - |b.n|^2) -
  //               sqrt(sin^2(r) |n|^2 - |a.n|^2)| > (aXb).n
  //
  // The code below is more complicated than this because many expressions
  // have been modified for better numerical stability.  For example, dot
  // products between unit vectors are computed using (x - y).DotProd(x + y),
  // and the dot product between a point P and the normal N of an edge X is
  // measured using (P - Xi).DotProd(N) where Xi is the endpoint of X that is
  // closer to P.

  Vector3<T> n = (x0 - x1).CrossProd(x0 + x1);  // 2 * x0.CrossProd(x1)
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  // This factor is used in the error terms of dot products with "n" below.
  T Dn_error = ((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;

  T cos_r = 1 - 0.5 * r2;
  T sin2_r = r2 * (1 - 0.25 * r2);
  T n2sin2_r = n2 * sin2_r;

  // "ra" and "rb" denote sin(ra) and sin(rb) after the scaling above.
  T ax2, aDn = (a - GetClosestVertex(a, x0, x1, &ax2)).DotProd(n);
  T aDn2 = aDn * aDn;
  T aDn_error = Dn_error * sqrt(ax2);
  T ra2 = n2sin2_r - aDn2;
  T ra2_error = (8 * DBL_ERR + 4 * T_ERR) * aDn2 +
      (2 * fabs(aDn) + aDn_error) * aDn_error + 6 * T_ERR * n2sin2_r;
  // This is the minimum possible value of ra2, which is used to bound the
  // derivative of sqrt(ra2) in computing ra_error below.
  T min_ra2 = ra2 - ra2_error;
  if (min_ra2 < 0) return Excluded::UNCERTAIN;
  T ra = sqrt(ra2);
  // Includes the ra2 subtraction error above.
  T ra_error = 1.5 * T_ERR * ra + 0.5 * ra2_error / sqrt(min_ra2);

  T bx2, bDn = (b - GetClosestVertex(b, x0, x1, &bx2)).DotProd(n);
  T bDn2 = bDn * bDn;
  T bDn_error = Dn_error * sqrt(bx2);
  T rb2 = n2sin2_r - bDn2;
  T rb2_error = (8 * DBL_ERR + 4 * T_ERR) * bDn2 +
      (2 * fabs(bDn) + bDn_error) * bDn_error + 6 * T_ERR * n2sin2_r;
  T min_rb2 = rb2 - rb2_error;
  if (min_rb2 < 0) return Excluded::UNCERTAIN;
  T rb = sqrt(rb2);
  // Includes the rb2 subtraction error above.
  T rb_error = 1.5 * T_ERR * rb + 0.5 * rb2_error / sqrt(min_rb2);

  // The sign of LHS(3) determines which site may be excluded by the other.
  T lhs3 = cos_r * (rb - ra);
  T abs_lhs3 = fabs(lhs3);
  T lhs3_error = cos_r * (ra_error + rb_error) + 3 * T_ERR * abs_lhs3;

  // Now we evaluate the RHS of (3), which is proportional to sin(d).
  Vector3<T> aXb = (a - b).CrossProd(a + b);  // 2 * a.CrossProd(b)
  T aXb1 = aXb.Norm();
  T sin_d = 0.5 * aXb.DotProd(n);
  T sin_d_error = (4 * DBL_ERR + (2.5 + 2 * sqrt(3)) * T_ERR) * aXb1 * n1 +
      16 * sqrt(3) * DBL_ERR * T_ERR * (aXb1 + n1);

  // If LHS(3) is definitely less than RHS(3), neither site excludes the other.
  T result = abs_lhs3 - sin_d;
  T result_error = lhs3_error + sin_d_error;
  if (result < -result_error) return Excluded::NEITHER;

  // Otherwise, before proceeding further we need to check that |d| <= Pi/2.
  // In fact, |d| < Pi/2 is enough because of the requirement that r < Pi/2.
  // The following expression represents cos(d) after scaling; it is
  // equivalent to (aXn).(bXn) but has about 30% less error.
  T cos_d = a.DotProd(b) * n2 - aDn * bDn;
  T cos_d_error =
      ((8 * DBL_ERR + 5 * T_ERR) * fabs(aDn) + aDn_error) * fabs(bDn) +
      (fabs(aDn) + aDn_error) * bDn_error + (8 * DBL_ERR + 8 * T_ERR) * n2;
  if (cos_d <= -cos_d_error) return Excluded::NEITHER;

  // Potential optimization: if the sign of cos(d) is uncertain, then instead
  // we could check whether cos(d) >= cos(r).  Unfortunately this is fairly
  // expensive since it requires computing denominator |aXn||bXn| of cos(d)
  // and the associated error bounds.  In any case this case is relatively
  // rare so it seems better to punt.
  if (cos_d < cos_d_error) return Excluded::UNCERTAIN;

  // Normally we have d > 0 because the sites are sorted so that A is closer
  // to X0 and B is closer to X1.  However if the edge X is longer than Pi/2,
  // and the sites A and B are beyond its endpoints, then AB can wrap around
  // the sphere in the opposite direction from X.  In this situation d < 0 but
  // each site is closest to one endpoint of X, so neither excludes the other.
  //
  // It turns out that this can happen only when the site that is further away
  // from edge X is less than 90 degrees away from whichever endpoint of X it
  // is closer to.  It is provable that if this distance is less than 90
  // degrees, then it is also less than r2, and therefore the Voronoi regions
  // of both sites intersect the edge.
  if (sin_d < -sin_d_error) {
    T r90 = S1ChordAngle::Right().length2();
    // "ca" is negative if Voronoi region A definitely intersects edge X.
    int ca = (lhs3 < -lhs3_error) ? -1 : TriageCompareCosDistance(a, x0, r90);
    int cb = (lhs3 > lhs3_error) ? -1 : TriageCompareCosDistance(b, x1, r90);
    if (ca < 0 && cb < 0) return Excluded::NEITHER;
    if (ca <= 0 && cb <= 0) return Excluded::UNCERTAIN;
    if (abs_lhs3 <= lhs3_error) return Excluded::UNCERTAIN;
  } else if (sin_d <= sin_d_error) {
    return Excluded::UNCERTAIN;
  }
  // Now we can finish checking the results of predicate (3).
  if (result <= result_error) return Excluded::UNCERTAIN;
  S2_DCHECK_GT(abs_lhs3, lhs3_error);
  return (lhs3 > 0) ? Excluded::FIRST : Excluded::SECOND;
}